

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_event.c
# Opt level: O3

void duckdb_je_te_assert_invariants_debug(tsd_t *tsd)

{
  return;
}

Assistant:

void
te_assert_invariants_debug(tsd_t *tsd) {
	te_ctx_t ctx;
	te_ctx_get(tsd, &ctx, true);
	te_assert_invariants_impl(tsd, &ctx);

	te_ctx_get(tsd, &ctx, false);
	te_assert_invariants_impl(tsd, &ctx);
}